

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O2

void save_tx(storage_t *st,void *key,size_t keylen,tx_type_t type)

{
  fdb_status fVar1;
  void *value;
  char txkey [12];
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  gen_random(txkey,0xc);
  value = calloc(1,0x418);
  *(tx_type_t *)((long)value + 0x410) = type;
  *(size_t *)((long)value + 0x408) = keylen;
  memcpy((void *)((long)value + 4),key,keylen);
  fVar1 = fdb_set_kv(st->rtx,txkey,0xc,value,0x418);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    free(value);
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
          ,0xa2);
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2espec.cc"
                ,0xa2,"void save_tx(storage_t *, void *, size_t, tx_type_t)");
}

Assistant:

void save_tx(storage_t *st, void *key, size_t keylen, tx_type_t type){

    TEST_INIT();
    char txkey[12];
    transaction_t *tx = NULL;
    fdb_status status;

    gen_random(txkey, 12);
    tx = (transaction_t*)malloc(sizeof(transaction_t));
    memset(tx, 0, sizeof(transaction_t));
    tx->type = type;
    tx->refkey_len = keylen;
    memcpy(tx->refkey, key, keylen);

    status = fdb_set_kv(st->rtx, txkey, 12,
                        tx, sizeof(transaction_t));
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    free(tx);
    tx=NULL;

}